

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.cpp
# Opt level: O0

void __thiscall dg::pta::PointerSubgraph::computeLoops(PointerSubgraph *this)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  reference ppPVar3;
  reference ppPVar4;
  mapped_type *pmVar5;
  long in_RDI;
  PSNode *nd;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *scc;
  iterator __end2;
  iterator __begin2;
  SCC_t *__range2;
  SCC_t SCCs;
  PSNode *in_stack_fffffffffffffe98;
  SCC<dg::pta::PSNode> *in_stack_fffffffffffffea0;
  PSNode *in_stack_fffffffffffffeb0;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_140;
  vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  *in_stack_fffffffffffffec8;
  vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  *in_stack_fffffffffffffed0;
  __normal_iterator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_*,_std::vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>_>
  local_120;
  undefined1 *local_118;
  undefined1 local_110 [240];
  undefined1 local_20 [32];
  
  *(undefined1 *)(in_RDI + 4) = 1;
  memset(local_110,0,0xf0);
  SCC<dg::pta::PSNode>::SCC(in_stack_fffffffffffffea0);
  SCC<dg::pta::PSNode>::compute(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::
  vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  ::vector(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  SCC<dg::pta::PSNode>::~SCC(in_stack_fffffffffffffea0);
  local_118 = local_20;
  local_120._M_current =
       (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
       std::
       vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
       ::begin((vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
                *)in_stack_fffffffffffffe98);
  std::
  vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  ::end((vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
         *)in_stack_fffffffffffffe98);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_*,_std::vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>_>
                        *)in_stack_fffffffffffffea0,
                       (__normal_iterator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_*,_std::vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>_>
                        *)in_stack_fffffffffffffe98);
    if (!bVar1) {
      std::
      vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
      ::~vector((vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
                 *)in_stack_fffffffffffffeb0);
      return;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_*,_std::vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>_>
              ::operator*(&local_120);
    bVar1 = std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::empty
                      ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                       in_stack_fffffffffffffeb0);
    if (!bVar1) {
      sVar2 = std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::size(this_00);
      if (sVar2 == 1) {
        std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::operator[](this_00,0);
        in_stack_fffffffffffffea0 =
             (SCC<dg::pta::PSNode> *)
             SubgraphNode<dg::pta::PSNode>::getSingleSuccessorOrNull
                       ((SubgraphNode<dg::pta::PSNode> *)in_stack_fffffffffffffe98);
        ppPVar3 = std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::operator[]
                            (this_00,0);
        if (in_stack_fffffffffffffea0 != (SCC<dg::pta::PSNode> *)*ppPVar3) goto LAB_00158617;
      }
      std::
      vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
      ::push_back((vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
                   *)in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98);
      std::
      vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
      ::back((vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
              *)in_stack_fffffffffffffea0);
      local_140._M_current =
           (PSNode **)
           std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                     ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                      in_stack_fffffffffffffe98);
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                 in_stack_fffffffffffffe98);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_stack_fffffffffffffea0,
                                (__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_stack_fffffffffffffe98), bVar1) {
        ppPVar4 = __gnu_cxx::
                  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  ::operator*(&local_140);
        in_stack_fffffffffffffeb0 = *ppPVar4;
        sVar2 = std::
                vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
                ::size((vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
                        *)(in_RDI + 8));
        in_stack_fffffffffffffe98 = (PSNode *)(sVar2 - 1);
        pmVar5 = std::
                 unordered_map<const_dg::pta::PSNode_*,_unsigned_long,_std::hash<const_dg::pta::PSNode_*>,_std::equal_to<const_dg::pta::PSNode_*>,_std::allocator<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>_>_>
                 ::operator[]((unordered_map<const_dg::pta::PSNode_*,_unsigned_long,_std::hash<const_dg::pta::PSNode_*>,_std::equal_to<const_dg::pta::PSNode_*>,_std::allocator<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>_>_>
                               *)in_stack_fffffffffffffea0,(key_type *)in_stack_fffffffffffffe98);
        *pmVar5 = (mapped_type)in_stack_fffffffffffffe98;
        __gnu_cxx::
        __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
        ::operator++(&local_140);
      }
    }
LAB_00158617:
    __gnu_cxx::
    __normal_iterator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_*,_std::vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>_>
    ::operator++(&local_120);
  } while( true );
}

Assistant:

void PointerSubgraph::computeLoops() {
    // FIXME: remember just that a node is on loop, not the whole loops

    assert(root);
    assert(!computedLoops() && "computeLoops() called repeatedly");
    _computed_loops = true;

    DBG(pta, "Computing information about loops");

    // compute the strongly connected components
    auto SCCs = SCC<PSNode>().compute(root);
    for (auto &scc : SCCs) {
        if (scc.empty())
            continue;
        // self-loop is also loop
        if (scc.size() == 1 && scc[0]->getSingleSuccessorOrNull() != scc[0])
            continue;

        _loops.push_back(std::move(scc));

        for (auto *nd : _loops.back()) {
            assert(_node_to_loop.find(nd) == _node_to_loop.end());
            _node_to_loop[nd] = _loops.size() - 1;
        }
    }
}